

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall
CVmRun::new_and_store_r0(CVmRun *this,uchar *pc,uint metaclass_idx,uint argc,int is_transient)

{
  vm_obj_id_t vVar1;
  uchar *local_10;
  
  local_10 = pc;
  vVar1 = CVmMetaTable::create_from_stack(G_meta_table_X,&local_10,metaclass_idx,argc);
  if (vVar1 == 0) {
    r0_.typ = VM_NIL;
  }
  else {
    r0_.typ = VM_OBJ;
    r0_.val.obj = vVar1;
    if (is_transient != 0) {
      *(ushort *)&G_obj_table_X.pages_[vVar1 >> 0xc][vVar1 & 0xfff].field_0x14 =
           *(ushort *)&G_obj_table_X.pages_[vVar1 >> 0xc][vVar1 & 0xfff].field_0x14 | 0x80;
    }
  }
  return local_10;
}

Assistant:

const uchar *CVmRun::new_and_store_r0(VMG_ const uchar *pc,
                                      uint metaclass_idx, uint argc,
                                      int is_transient)
{
    vm_obj_id_t obj;
    
    /* create the object */
    obj = G_meta_table->create_from_stack(vmg_ &pc, metaclass_idx, argc);

    /* if we got a valid object, store a reference to it in R0 */
    if (obj != VM_INVALID_OBJ)
    {
        /* set the object return value */
        r0_.set_obj(obj);

        /* make the object transient if desired */
        if (is_transient)
            G_obj_table->set_obj_transient(obj);
    }
    else
    {
        /* failed - return nil */
        r0_.set_nil();
    }

    /* return the new instruction pointer */
    return pc;
}